

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O0

StringBuilder * __thiscall Potassco::StringBuilder::append(StringBuilder *this,char *str,size_t n)

{
  Type TVar1;
  char *pcVar2;
  unsigned_long *puVar3;
  void *in_RSI;
  StringBuilder *__ptr;
  StringBuilder *in_RDI;
  Buffer buf;
  size_t in_stack_00000058;
  StringBuilder *in_stack_00000060;
  unsigned_long local_38;
  Buffer local_30;
  size_t local_18;
  void *local_10;
  
  local_10 = in_RSI;
  TVar1 = type((StringBuilder *)0x140742);
  if (TVar1 == Str) {
    std::__cxx11::string::append((in_RDI->field_0).buf_.head,(ulong)local_10);
  }
  else {
    __ptr = in_RDI;
    grow(in_stack_00000060,in_stack_00000058);
    pcVar2 = Buffer::pos(&local_30);
    Buffer::free(&local_30,__ptr);
    puVar3 = std::min<unsigned_long>(&local_18,&local_38);
    local_18 = *puVar3;
    memcpy(pcVar2,local_10,local_18);
    pcVar2 = Buffer::pos(&local_30);
    pcVar2[local_18] = '\0';
  }
  return in_RDI;
}

Assistant:

StringBuilder& StringBuilder::append(const char* str, std::size_t n) {
	if (type() == Str) {
		str_->append(str, n);
	}
	else {
		Buffer buf = grow(n);
		std::memcpy(buf.pos(), str, n = std::min(n, buf.free()));
		buf.pos()[n] = 0;
	}
	return *this;
}